

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::TextFormat::Printer::Print
          (Printer *this,Message *message,BaseTextGenerator *generator)

{
  bool bVar1;
  int size;
  Reflection *pRVar2;
  void *data;
  pointer ppVar3;
  pointer pMVar4;
  iterator local_b0;
  undefined1 local_a0 [8];
  const_iterator itr;
  Descriptor *descriptor;
  ArrayInputStream input;
  undefined1 local_58 [8];
  string serialized;
  UnknownFieldSet unknown_fields;
  Reflection *reflection;
  BaseTextGenerator *generator_local;
  Message *message_local;
  Printer *this_local;
  
  pRVar2 = Message::GetReflection(message);
  if (pRVar2 == (Reflection *)0x0) {
    UnknownFieldSet::UnknownFieldSet((UnknownFieldSet *)((long)&serialized.field_2 + 8));
    MessageLite::SerializeAsString_abi_cxx11_((string *)local_58,&message->super_MessageLite);
    data = (void *)std::__cxx11::string::data();
    size = std::__cxx11::string::size();
    io::ArrayInputStream::ArrayInputStream((ArrayInputStream *)&descriptor,data,size,-1);
    UnknownFieldSet::ParseFromZeroCopyStream
              ((UnknownFieldSet *)((long)&serialized.field_2 + 8),(ZeroCopyInputStream *)&descriptor
              );
    io::ArrayInputStream::~ArrayInputStream((ArrayInputStream *)&descriptor);
    std::__cxx11::string::~string((string *)local_58);
    PrintUnknownFields(this,(UnknownFieldSet *)((long)&serialized.field_2 + 8),generator,10);
    UnknownFieldSet::~UnknownFieldSet((UnknownFieldSet *)((long)&serialized.field_2 + 8));
  }
  else {
    itr.inner_.field_1.slot_ = (slot_type *)Message::GetDescriptor(message);
    _local_a0 = (iterator)
                absl::lts_20250127::container_internal::
                raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,std::unique_ptr<google::protobuf::TextFormat::MessagePrinter_const,std::default_delete<google::protobuf::TextFormat::MessagePrinter_const>>>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,std::unique_ptr<google::protobuf::TextFormat::MessagePrinter_const,std::default_delete<google::protobuf::TextFormat::MessagePrinter_const>>>>>
                ::find<google::protobuf::Descriptor_const*>
                          ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,std::unique_ptr<google::protobuf::TextFormat::MessagePrinter_const,std::default_delete<google::protobuf::TextFormat::MessagePrinter_const>>>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,std::unique_ptr<google::protobuf::TextFormat::MessagePrinter_const,std::default_delete<google::protobuf::TextFormat::MessagePrinter_const>>>>>
                            *)&this->custom_message_printers_,
                           (key_arg<const_google::protobuf::Descriptor_*> *)
                           &itr.inner_.field_1.slot_);
    local_b0 = (iterator)
               absl::lts_20250127::container_internal::
               raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>_>
               ::end((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>_>
                      *)&this->custom_message_printers_);
    bVar1 = absl::lts_20250127::container_internal::operator!=
                      ((const_iterator *)local_a0,(const_iterator *)&local_b0);
    if (bVar1) {
      ppVar3 = absl::lts_20250127::container_internal::
               raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>_>
               ::const_iterator::operator->((const_iterator *)local_a0);
      pMVar4 = std::
               unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>
               ::operator->(&ppVar3->second);
      (**(code **)(*(long *)pMVar4 + 0x10))(pMVar4,message,this->single_line_mode_ & 1,generator);
    }
    else {
      PrintMessage(this,message,generator);
    }
  }
  return;
}

Assistant:

void TextFormat::Printer::Print(const Message& message,
                                BaseTextGenerator* generator) const {
  const Reflection* reflection = message.GetReflection();
  if (!reflection) {
    // This message does not provide any way to describe its structure.
    // Parse it again in an UnknownFieldSet, and display this instead.
    UnknownFieldSet unknown_fields;
    {
      std::string serialized = message.SerializeAsString();
      io::ArrayInputStream input(serialized.data(), serialized.size());
      unknown_fields.ParseFromZeroCopyStream(&input);
    }
    PrintUnknownFields(unknown_fields, generator, kUnknownFieldRecursionLimit);
    return;
  }
  const Descriptor* descriptor = message.GetDescriptor();
  auto itr = custom_message_printers_.find(descriptor);
  if (itr != custom_message_printers_.end()) {
    itr->second->Print(message, single_line_mode_, generator);
    return;
  }
  PrintMessage(message, generator);
}